

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * __thiscall
ghc::filesystem::path::operator+=(path *this,basic_string_view<char,_std::char_traits<char>_> x)

{
  path *ppVar1;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_10._M_str = x._M_str;
  local_10._M_len = x._M_len;
  ppVar1 = concat<std::basic_string_view<char,std::char_traits<char>>>(this,&local_10);
  return ppVar1;
}

Assistant:

GHC_INLINE path& path::operator+=(std::basic_string_view<value_type> x)
{
    return concat(x);
}